

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BringWindowToDisplayBack(ImGuiWindow *window)

{
  uint uVar1;
  ImGuiWindow **__src;
  ImGuiContext *pIVar2;
  ulong uVar3;
  size_t __n;
  
  pIVar2 = GImGui;
  __src = (GImGui->Windows).Data;
  if (*__src != window) {
    uVar1 = (GImGui->Windows).Size;
    __n = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = __n;
    }
    for (; uVar3 * 8 != __n; __n = __n + 8) {
      if (*(ImGuiWindow **)((long)__src + __n) == window) {
        memmove(__src + 1,__src,__n);
        *(pIVar2->Windows).Data = window;
        return;
      }
    }
  }
  return;
}

Assistant:

void ImGui::BringWindowToDisplayBack(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.Windows[0] == window)
        return;
    for (int i = 0; i < g.Windows.Size; i++)
        if (g.Windows[i] == window)
        {
            memmove(&g.Windows[1], &g.Windows[0], (size_t)i * sizeof(ImGuiWindow*));
            g.Windows[0] = window;
            break;
        }
}